

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReFinalize.cpp
# Opt level: O1

void __thiscall
wasm::ReFinalize::replaceUntaken(ReFinalize *this,Expression *value,Expression *condition)

{
  Drop *this_00;
  ulong in_RCX;
  optional<wasm::Type> type;
  Builder local_30;
  Builder builder;
  
  if ((value->type).id != 1) {
    __assert_fail("value->type == Type::unreachable",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/ReFinalize.cpp"
                  ,0xde,"void wasm::ReFinalize::replaceUntaken(Expression *, Expression *)");
  }
  if (condition != (Expression *)0x0) {
    local_30.wasm =
         (this->
         super_WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
         ).super_PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>.
         super_Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>.currModule
    ;
    this_00 = (Drop *)condition;
    if (1 < (condition->type).id) {
      this_00 = (Drop *)MixedArena::allocSpace(&(local_30.wasm)->allocator,0x18,8);
      (this_00->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression._id = DropId;
      (this_00->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression.type.id = 0;
      this_00->value = condition;
      Drop::finalize(this_00);
    }
    type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._8_8_ = 0;
    type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)in_RCX;
    value = (Expression *)Builder::makeSequence(&local_30,value,(Expression *)this_00,type);
    if (6 < (((Block *)value)->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.
            type.id) {
      __assert_fail("replacement->type.isBasic() && \"Basic type expected\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/ReFinalize.cpp"
                    ,0xef,"void wasm::ReFinalize::replaceUntaken(Expression *, Expression *)");
    }
  }
  Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>::replaceCurrent
            (&(this->
              super_WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
              ).super_PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>
              .super_Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>,
             value);
  return;
}

Assistant:

void ReFinalize::replaceUntaken(Expression* value, Expression* condition) {
  assert(value->type == Type::unreachable);
  auto* replacement = value;
  if (condition) {
    Builder builder(*getModule());
    // Even if we have
    //  (block
    //   (unreachable)
    //   (i32.const 1)
    //  )
    // we want the block type to be unreachable. That is valid as
    // the value is unreachable, and necessary since the type of
    // the condition did not have an impact before (the break/switch
    // type was unreachable), and might not fit in.
    if (condition->type.isConcrete()) {
      condition = builder.makeDrop(condition);
    }
    replacement = builder.makeSequence(value, condition);
    assert(replacement->type.isBasic() && "Basic type expected");
  }
  replaceCurrent(replacement);
}